

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::GetConfigsBoundsCase::iterate(GetConfigsBoundsCase *this)

{
  deUint32 *__return_storage_ptr__;
  int numConfigAll_00;
  int numConfigRequested;
  MessageBuilder *pMVar1;
  MessageBuilder local_4c8;
  int local_344;
  undefined1 local_340 [4];
  int i;
  Random rnd;
  MessageBuilder local_1a0;
  int local_1c;
  TestLog *pTStack_18;
  EGLint numConfigAll;
  TestLog *log;
  GetConfigsBoundsCase *this_local;
  
  log = (TestLog *)this;
  pTStack_18 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
  eglu::CallLogWrapper::eglGetConfigs
            (&this->super_CallLogWrapper,this->m_display,(EGLConfig *)0x0,0,&local_1c);
  tcu::TestLog::operator<<(&local_1a0,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,&local_1c);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [19])" configs available");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  __return_storage_ptr__ = &rnd.m_rnd.z;
  tcu::TestLog::operator<<
            ((MessageBuilder *)__return_storage_ptr__,pTStack_18,
             (BeginMessageToken *)&tcu::TestLog::Message);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)__return_storage_ptr__,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&rnd.m_rnd.z);
  if (local_1c < 1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "No configs");
  }
  else {
    de::Random::Random((Random *)local_340,0x7b);
    for (local_344 = 0; numConfigAll_00 = local_1c, local_344 < 5; local_344 = local_344 + 1) {
      numConfigRequested = de::Random::getInt((Random *)local_340,0,local_1c);
      checkGetConfigsBounds(this,(Random *)local_340,numConfigAll_00,numConfigRequested);
      tcu::TestLog::operator<<(&local_4c8,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
      tcu::MessageBuilder::operator<<(&local_4c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4c8);
    }
    checkGetConfigsBounds(this,(Random *)local_340,local_1c,-1);
    de::Random::~Random((Random *)local_340);
  }
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		tcu::TestLog&	log		= m_testCtx.getLog();
		EGLint			numConfigAll;

		enableLogging(true);

		eglGetConfigs(m_display, 0, 0, &numConfigAll);

		log << TestLog::Message << numConfigAll << " configs available" << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		if (numConfigAll > 0)
		{
			de::Random		rnd					(123);

			for (int i = 0; i < 5; i++)
			{
				checkGetConfigsBounds(rnd, numConfigAll, rnd.getInt(0, numConfigAll));
				log << TestLog::Message << TestLog::EndMessage;
			}

			checkGetConfigsBounds(rnd, numConfigAll, -1);
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "No configs");
		}

		enableLogging(false);

		return STOP;
	}